

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

bool __thiscall
antlr::CharScannerLiteralsLess::operator()(CharScannerLiteralsLess *this,string *x,string *y)

{
  int iVar1;
  ulong uVar2;
  char *__s1;
  char *__s2;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  uVar2 = (**(code **)(*(long *)*in_RDI + 0xa8))();
  if ((uVar2 & 1) == 0) {
    __s1 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcasecmp(__s1,__s2);
    local_1 = iVar1 < 0;
  }
  else {
    local_1 = std::
              less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x14a04e);
  }
  return local_1;
}

Assistant:

inline bool CharScannerLiteralsLess::operator() (const ANTLR_USE_NAMESPACE(std)string& x,const ANTLR_USE_NAMESPACE(std)string& y) const
{
	if (scanner->getCaseSensitiveLiterals())
		return ANTLR_USE_NAMESPACE(std)less<ANTLR_USE_NAMESPACE(std)string>()(x,y);
	else
	{
#ifdef NO_STRCASECMP
		return (_stricmp(x.c_str(),y.c_str())<0);
#else
		return (strcasecmp(x.c_str(),y.c_str())<0);
#endif
	}